

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O0

int Kit_GraphLeafDepth_rec(Kit_Graph_t *pGraph,Kit_Node_t *pNode,Kit_Node_t *pLeaf)

{
  int iVar1;
  Kit_Node_t *pKVar2;
  int local_50;
  int local_4c;
  int Depth;
  int Depth1;
  int Depth0;
  Kit_Node_t *pLeaf_local;
  Kit_Node_t *pNode_local;
  Kit_Graph_t *pGraph_local;
  
  if (pNode == pLeaf) {
    pGraph_local._4_4_ = 0;
  }
  else {
    iVar1 = Kit_GraphNodeIsVar(pGraph,pNode);
    if (iVar1 == 0) {
      pKVar2 = Kit_GraphNodeFanin0(pGraph,pNode);
      iVar1 = Kit_GraphLeafDepth_rec(pGraph,pKVar2,pLeaf);
      pKVar2 = Kit_GraphNodeFanin1(pGraph,pNode);
      local_4c = Kit_GraphLeafDepth_rec(pGraph,pKVar2,pLeaf);
      if (local_4c < iVar1) {
        local_4c = iVar1;
      }
      if (local_4c == -100) {
        local_50 = -100;
      }
      else {
        local_50 = local_4c + 1;
      }
      pGraph_local._4_4_ = local_50;
    }
    else {
      pGraph_local._4_4_ = -100;
    }
  }
  return pGraph_local._4_4_;
}

Assistant:

int Kit_GraphLeafDepth_rec( Kit_Graph_t * pGraph, Kit_Node_t * pNode, Kit_Node_t * pLeaf )
{
    int Depth0, Depth1, Depth;
    if ( pNode == pLeaf )
        return 0;
    if ( Kit_GraphNodeIsVar(pGraph, pNode) )
        return -100;
    Depth0 = Kit_GraphLeafDepth_rec( pGraph, Kit_GraphNodeFanin0(pGraph, pNode), pLeaf );
    Depth1 = Kit_GraphLeafDepth_rec( pGraph, Kit_GraphNodeFanin1(pGraph, pNode), pLeaf );
    Depth = KIT_MAX( Depth0, Depth1 );
    Depth = (Depth == -100) ? -100 : Depth + 1;
    return Depth;
}